

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O3

void Cec_GiaPrintCofStats2(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  Gia_Man_t *p_00;
  Gia_Man_t *p_01;
  ulong uVar5;
  ulong uVar6;
  
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(p);
  pVVar4 = p->vCis;
  uVar5 = (ulong)(uint)pVVar4->nSize;
  if (p->nRegs < pVVar4->nSize) {
    uVar6 = 0;
    do {
      if ((long)(int)uVar5 <= (long)uVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pVVar4->pArray[uVar6];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar1 = p->pObjs + iVar2;
      p_00 = Gia_ManDupCofactorVar(p,(int)uVar6,0);
      p_01 = Gia_ManDupCofactorVar(p,(int)uVar6,1);
      printf("PI %5d :   ",uVar6 & 0xffffffff);
      pGVar3 = p->pObjs;
      if ((pGVar1 < pGVar3) || (pGVar3 + p->nObjs <= pGVar1)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      printf("Refs = %5d   ",
             (ulong)(uint)p->pRefs[(int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555]);
      printf("Cof0 = %7d   ",(ulong)(uint)(~(p_00->vCos->nSize + p_00->vCis->nSize) + p_00->nObjs));
      printf("Cof1 = %7d   ",(ulong)(uint)(~(p_01->vCos->nSize + p_01->vCis->nSize) + p_01->nObjs));
      putchar(10);
      Gia_ManStop(p_00);
      Gia_ManStop(p_01);
      uVar6 = uVar6 + 1;
      pVVar4 = p->vCis;
      uVar5 = (ulong)pVVar4->nSize;
    } while ((long)uVar6 < (long)(uVar5 - (long)p->nRegs));
  }
  return;
}

Assistant:

void Cec_GiaPrintCofStats2( Gia_Man_t * p )
{
    Gia_Man_t * pCof0, * pCof1;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    Gia_ManForEachPi( p, pObj, i )
    {
        pCof0 = Gia_ManDupCofactorVar( p, i, 0 );
        pCof1 = Gia_ManDupCofactorVar( p, i, 1 );
        printf( "PI %5d :   ",   i );
        printf( "Refs = %5d   ", Gia_ObjRefNum(p, pObj) );
        printf( "Cof0 = %7d   ", Gia_ManAndNum(pCof0) );
        printf( "Cof1 = %7d   ", Gia_ManAndNum(pCof1) );
        printf( "\n" );
        Gia_ManStop( pCof0 );
        Gia_ManStop( pCof1 );
    }
}